

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::GetMissileDamage(AActor *this,int mask,int add)

{
  uint uVar1;
  int iVar2;
  VMFrameStack *this_00;
  int iVar3;
  int amount;
  VMValue param;
  VMReturn result;
  
  if (this->DamageVal < 0) {
    if (this->DamageFunc == (VMFunction *)0x0) {
      __assert_fail("false && \"No damage function found\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0xd24,"int AActor::GetMissileDamage(int, int)");
    }
    param.field_0.field_1.atag = 1;
    param.field_0.field_3.Type = '\x03';
    result.Location = &amount;
    result.TagOfs = 0;
    result.RegType = '\0';
    param.field_0.field_1.a = this;
    this_00 = (VMFrameStack *)_ZTW13GlobalVMStack();
    iVar2 = VMFrameStack::Call(this_00,this->DamageFunc,&param,1,&result,1,(VMException **)0x0);
    iVar3 = 0;
    if (0 < iVar2) {
      iVar3 = amount;
    }
    VMValue::~VMValue(&param);
  }
  else if (mask == 0) {
    iVar3 = this->DamageVal * add;
  }
  else {
    uVar1 = FRandom::operator()(&pr_missiledamage);
    iVar3 = ((uVar1 & mask) + add) * this->DamageVal;
  }
  return iVar3;
}

Assistant:

int AActor::GetMissileDamage (int mask, int add)
{
	if (DamageVal >= 0)
	{
		if (mask == 0)
		{
			return add * DamageVal;
		}
		else
		{
			return ((pr_missiledamage() & mask) + add) * DamageVal;
		}
	}
	if (DamageFunc == nullptr)
	{
		// This should never happen
		assert(false && "No damage function found");
		return 0;
	}
	VMValue param = this;
	VMReturn result;

	int amount;

	result.IntAt(&amount);

	if (GlobalVMStack.Call(DamageFunc, &param, 1, &result, 1) < 1)
	{ // No results
		return 0;
	}
	return amount;
}